

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FuncflParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FuncflParameters> *this)

{
  FuncflParameters *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__SimpleTypeData_00564d68;
  FuncflParameters::~FuncflParameters(in_RDI);
  GenericData::~GenericData((GenericData *)0x3e0604);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}